

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O3

void VP8CodeIntraModes(VP8Encoder *enc)

{
  VP8BitWriter *bw;
  byte bVar1;
  byte bVar2;
  VP8MBInfo *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  byte bVar8;
  byte *pbVar9;
  byte bVar10;
  long lVar11;
  VP8EncIterator it;
  VP8EncIterator local_f38;
  
  bw = &enc->bw_;
  VP8IteratorInit(enc,&local_f38);
  do {
    pbVar9 = local_f38.preds_;
    pVVar3 = local_f38.mb_;
    if ((enc->segment_hdr_).update_map_ != 0) {
      bVar10 = *(byte *)local_f38.mb_;
      iVar4 = VP8PutBit(bw,bVar10 >> 6 & 1,(uint)(enc->proba_).segments_[0]);
      VP8PutBit(bw,bVar10 >> 5 & 1,(uint)*(byte *)((long)enc + (0xe22 - (ulong)(iVar4 == 0))));
    }
    if ((enc->proba_).use_skip_proba_ != 0) {
      VP8PutBit(bw,(uint)*pVVar3 >> 4 & 1,(uint)(enc->proba_).skip_proba_);
    }
    iVar4 = VP8PutBit(bw,(uint)(((uint)*pVVar3 & 3) != 0),0x91);
    if (iVar4 == 0) {
      iVar4 = enc->preds_w_;
      iVar5 = 0;
      do {
        lVar11 = 0;
        bVar10 = pbVar9[-1];
        do {
          bVar1 = pbVar9[lVar11 - iVar4];
          bVar2 = pbVar9[lVar11];
          iVar6 = VP8PutBit(bw,(uint)(bVar2 != 0),(uint)kBModesProba[bVar1][bVar10][0]);
          if (iVar6 != 0) {
            iVar6 = VP8PutBit(bw,(uint)(bVar2 != 1),(uint)kBModesProba[bVar1][bVar10][1]);
            if (iVar6 != 0) {
              iVar6 = VP8PutBit(bw,(uint)(bVar2 != 2),(uint)kBModesProba[bVar1][bVar10][2]);
              if (iVar6 != 0) {
                iVar6 = VP8PutBit(bw,(uint)(5 < bVar2),(uint)kBModesProba[bVar1][bVar10][3]);
                if (iVar6 == 0) {
                  iVar6 = VP8PutBit(bw,(uint)(bVar2 != 3),(uint)kBModesProba[bVar1][bVar10][4]);
                  if (iVar6 != 0) {
                    lVar7 = 5;
                    bVar8 = 4;
LAB_001393ae:
                    VP8PutBit(bw,(uint)(bVar8 != bVar2),(uint)kBModesProba[bVar1][bVar10][lVar7]);
                  }
                }
                else {
                  iVar6 = VP8PutBit(bw,(uint)(bVar2 != 6),(uint)kBModesProba[bVar1][bVar10][6]);
                  if (iVar6 != 0) {
                    iVar6 = VP8PutBit(bw,(uint)(bVar2 != 7),(uint)kBModesProba[bVar1][bVar10][7]);
                    if (iVar6 != 0) {
                      lVar7 = 8;
                      bVar8 = 8;
                      goto LAB_001393ae;
                    }
                  }
                }
              }
            }
          }
          lVar11 = lVar11 + 1;
          bVar10 = bVar2;
        } while (lVar11 != 4);
        pbVar9 = pbVar9 + iVar4;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 4);
    }
    else {
      bVar10 = *pbVar9;
      iVar5 = VP8PutBit(bw,(uint)((bVar10 & 0xfd) == 1),0x9c);
      iVar4 = 0x80;
      if (iVar5 == 0) {
        iVar4 = 0xa3;
      }
      VP8PutBit(bw,(uint)((byte)((iVar5 == 0) + 1U) == bVar10),iVar4);
    }
    bVar10 = *(byte *)pVVar3 >> 2 & 3;
    iVar4 = VP8PutBit(bw,(uint)(bVar10 != 0),0x8e);
    if (iVar4 != 0) {
      iVar4 = VP8PutBit(bw,(uint)(bVar10 != 2),0x72);
      if (iVar4 != 0) {
        VP8PutBit(bw,(uint)(bVar10 != 3),0xb7);
      }
    }
    iVar4 = VP8IteratorNext(&local_f38);
    if (iVar4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void VP8CodeIntraModes(VP8Encoder* const enc) {
  VP8BitWriter* const bw = &enc->bw_;
  VP8EncIterator it;
  VP8IteratorInit(enc, &it);
  do {
    const VP8MBInfo* const mb = it.mb_;
    const uint8_t* preds = it.preds_;
    if (enc->segment_hdr_.update_map_) {
      PutSegment(bw, mb->segment_, enc->proba_.segments_);
    }
    if (enc->proba_.use_skip_proba_) {
      VP8PutBit(bw, mb->skip_, enc->proba_.skip_proba_);
    }
    if (VP8PutBit(bw, (mb->type_ != 0), 145)) {  // i16x16
      PutI16Mode(bw, preds[0]);
    } else {
      const int preds_w = enc->preds_w_;
      const uint8_t* top_pred = preds - preds_w;
      int x, y;
      for (y = 0; y < 4; ++y) {
        int left = preds[-1];
        for (x = 0; x < 4; ++x) {
          const uint8_t* const probas = kBModesProba[top_pred[x]][left];
          left = PutI4Mode(bw, preds[x], probas);
        }
        top_pred = preds;
        preds += preds_w;
      }
    }
    PutUVMode(bw, mb->uv_mode_);
  } while (VP8IteratorNext(&it));
}